

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::RenderDataPiece
          (DefaultValueObjectWriter *this,StringPiece name,DataPiece *data)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  undefined8 uVar5;
  int iVar6;
  LogMessage *pLVar7;
  Node *pNVar8;
  undefined4 extraout_var;
  long lVar9;
  int *piVar10;
  stringpiece_ssize_type len;
  LogMessage local_120;
  int local_e8 [2];
  StatusOr<const_google::protobuf::Type_*> found_type;
  code *local_a8;
  undefined1 local_98 [8];
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  data_string;
  LogFinisher local_31;
  
  lVar9 = name.length_;
  piVar10 = (int *)name.ptr_;
  MaybePopulateChildrenOfAny(this,this->current_);
  pTVar4 = this->current_->type_;
  if (((pTVar4 != (Type *)0x0) &&
      (iVar6 = std::__cxx11::string::compare((char *)(pTVar4->name_).ptr_), lVar9 == 5 && iVar6 == 0
      )) && ((piVar10 == (int *)"@type" || ((char)piVar10[1] == 'e' && *piVar10 == 0x70797440)))) {
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98,data);
    uVar5 = data_string.status_.error_message_.field_2._8_8_;
    if (local_98._0_4_ == OK) {
      data_string.value_.field_2._8_8_ = this->typeinfo_;
      if ((long)data_string.value_._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig
                  ((size_t)data_string.value_._M_dataplus._M_p,"size_t to int conversion");
      }
      (**(code **)(*(long *)data_string.value_.field_2._8_8_ + 0x10))
                (local_e8,data_string.value_.field_2._8_8_,uVar5,data_string.value_._M_dataplus._M_p
                );
      if (local_e8[0] == 0) {
        pNVar8 = this->current_;
        pNVar8->type_ = (Type *)found_type.status_.error_message_.field_2._8_8_;
      }
      else {
        protobuf::internal::LogMessage::LogMessage
                  (&local_120,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                   ,0x255);
        pLVar7 = protobuf::internal::LogMessage::operator<<(&local_120,"Failed to resolve type \'");
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (pLVar7,(string *)((long)&data_string.status_.error_message_.field_2 + 8)
                           );
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\'.");
        protobuf::internal::LogFinisher::operator=(&local_31,pLVar7);
        protobuf::internal::LogMessage::~LogMessage(&local_120);
        pNVar8 = this->current_;
      }
      pNVar8->is_any_ = true;
      if ((1 < (int)((ulong)((long)(pNVar8->children_).
                                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pNVar8->children_).
                                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
         (pNVar8->type_ != (Type *)0x0)) {
        (*pNVar8->_vptr_Node[2])(pNVar8,this->typeinfo_);
      }
      if ((size_type *)found_type.status_._0_8_ !=
          &found_type.status_.error_message_._M_string_length) {
        operator_delete((void *)found_type.status_._0_8_);
      }
    }
    if ((size_type *)data_string.status_.error_message_.field_2._8_8_ !=
        &data_string.value_._M_string_length) {
      operator_delete((void *)data_string.status_.error_message_.field_2._8_8_);
    }
    if ((size_type *)data_string.status_._0_8_ !=
        &data_string.status_.error_message_._M_string_length) {
      operator_delete((void *)data_string.status_._0_8_);
    }
  }
  pNVar8 = Node::FindChild(this->current_,name);
  if (pNVar8 == (Node *)0x0) {
    local_98 = (undefined1  [8])&data_string.status_.error_message_;
    if (piVar10 == (int *)0x0) {
      data_string.status_.error_code_ = OK;
      data_string.status_._4_4_ = 0;
      data_string.status_.error_message_._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,piVar10,lVar9 + (long)piVar10);
    }
    pNVar8 = this->current_;
  }
  else {
    if (pNVar8->kind_ == PRIMITIVE) {
      DataPiece::InternalCopy(&pNVar8->data_,data);
      pNVar8->is_placeholder_ = false;
      return;
    }
    local_98 = (undefined1  [8])&data_string.status_.error_message_;
    if (piVar10 == (int *)0x0) {
      data_string.status_.error_code_ = OK;
      data_string.status_._4_4_ = 0;
      data_string.status_.error_message_._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,piVar10,lVar9 + (long)piVar10);
    }
  }
  bVar1 = this->suppress_empty_list_;
  bVar2 = this->preserve_proto_field_names_;
  bVar3 = this->use_ints_for_enums_;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
              *)&found_type.value_,&this->field_scrub_callback_);
  iVar6 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                    (this,local_98,0,0,data,0,&pNVar8->path_,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,
                     &found_type.value_);
  if (local_a8 != (code *)0x0) {
    (*local_a8)((_Any_data *)&found_type.value_,(_Any_data *)&found_type.value_,__destroy_functor);
  }
  if (local_98 != (undefined1  [8])&data_string.status_.error_message_) {
    operator_delete((void *)local_98);
  }
  Node::AddChild(this->current_,(Node *)CONCAT44(extraout_var,iVar6));
  return;
}

Assistant:

void DefaultValueObjectWriter::RenderDataPiece(StringPiece name,
                                               const DataPiece& data) {
  MaybePopulateChildrenOfAny(current_);
  if (current_->type() != nullptr && current_->type()->name() == kAnyType &&
      name == "@type") {
    util::StatusOr<std::string> data_string = data.ToString();
    if (data_string.ok()) {
      const std::string& string_value = data_string.value();
      // If the type of current_ is "Any" and its "@type" field is being set
      // here, sets the type of current_ to be the type specified by the
      // "@type".
      util::StatusOr<const google::protobuf::Type*> found_type =
          typeinfo_->ResolveTypeUrl(string_value);
      if (!found_type.ok()) {
        GOOGLE_LOG(WARNING) << "Failed to resolve type '" << string_value << "'.";
      } else {
        current_->set_type(found_type.value());
      }
      current_->set_is_any(true);
      // If the "@type" field is placed after other fields, we should populate
      // other children of primitive type now. Otherwise, we should wait until
      // the first value field is rendered before we populate the children,
      // because the "value" field of a Any message could be omitted.
      if (current_->number_of_children() > 1 && current_->type() != nullptr) {
        current_->PopulateChildren(typeinfo_);
      }
    }
  }
  Node* child = current_->FindChild(name);
  if (child == nullptr || child->kind() != PRIMITIVE) {
    // No children are found, creates a new child.
    std::unique_ptr<Node> node(
        CreateNewNode(std::string(name), nullptr, PRIMITIVE, data, false,
                      child == nullptr ? current_->path() : child->path(),
                      suppress_empty_list_, preserve_proto_field_names_,
                      use_ints_for_enums_, field_scrub_callback_));
    current_->AddChild(node.release());
  } else {
    child->set_data(data);
    child->set_is_placeholder(false);
  }
}